

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 frame_size)

{
  ImGuiWindow *this;
  undefined1 auVar1 [12];
  bool bVar2;
  ImU32 IVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  uint in_XMM0_Db;
  ImVec2 IVar8;
  float fVar10;
  ImVec2 IVar9;
  uint in_XMM0_Dc;
  undefined4 uVar11;
  uint in_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined4 uVar12;
  float fVar13;
  float fVar14;
  undefined8 in_XMM2_Qb;
  undefined8 uVar16;
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  uint local_138;
  ImVec2 local_110;
  ImVec2 local_108;
  undefined8 uStack_100;
  ImGuiContext *local_f0;
  ImU32 local_e8;
  ImU32 local_e4;
  ImVec2 local_e0;
  ImRect local_d8;
  float local_c8;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  ImVec2 local_68;
  undefined1 local_58 [16];
  char *local_48;
  ImRect local_40;
  
  local_f0 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    uStack_a0 = in_XMM2_Qb;
    local_a8 = (undefined1  [8])frame_size;
    local_c8 = scale_max;
    local_b8 = scale_min;
    uStack_b4 = in_XMM0_Db;
    uStack_b0 = in_XMM0_Dc;
    uStack_ac = in_XMM0_Dd;
    local_108.x = (float)ImGuiWindow::GetID(this,label,(char *)0x0);
    local_68 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar16 = local_a8._8_8_;
    if ((local_a8._0_4_ == 0.0) && (!NAN(local_a8._0_4_))) {
      fVar6 = CalcItemWidth();
      auVar1._4_8_ = uVar16;
      auVar1._0_4_ = local_a8._4_4_;
      auVar15._0_8_ = auVar1._0_8_ << 0x20;
      auVar15._8_4_ = (undefined4)uStack_a0;
      auVar15._12_4_ = uStack_a0._4_4_;
      register0x000012c4 = auVar15._4_12_;
      local_a8._0_4_ = fVar6;
    }
    if ((local_a8._4_4_ == 0.0) && (!NAN(local_a8._4_4_))) {
      fVar6 = (local_f0->Style).FramePadding.y;
      local_a8._4_4_ = fVar6 + fVar6 + local_68.y;
    }
    IVar8.x = (this->DC).CursorPos.x + local_a8._0_4_;
    fVar6 = local_a8._4_4_ + (this->DC).CursorPos.y;
    IVar8.y = fVar6;
    local_d8.Min = (this->DC).CursorPos;
    local_58._0_4_ = (local_f0->Style).FramePadding.x;
    local_98._0_4_ = (local_f0->Style).FramePadding.y;
    fVar13 = 0.0;
    if (0.0 < local_68.x) {
      fVar13 = (local_f0->Style).ItemInnerSpacing.x + local_68.x;
    }
    fVar14 = local_d8.Min.x + (float)local_58._0_4_;
    local_78 = ZEXT416((uint)(local_d8.Min.y + (float)local_98._0_4_));
    local_40.Max.y = fVar6 + 0.0;
    local_40.Max.x = fVar13 + IVar8.x;
    local_d8.Max = IVar8;
    local_48 = label;
    local_40.Min = local_d8.Min;
    ItemSize(&local_40,(local_f0->Style).FramePadding.y);
    bVar2 = ItemAdd(&local_40,0,&local_d8);
    if (bVar2) {
      bVar2 = ItemHoverable(&local_d8,(ImGuiID)local_108.x);
      if (((local_b8 == 3.4028235e+38) && (!NAN(local_b8))) ||
         ((local_c8 == 3.4028235e+38 && (!NAN(local_c8))))) {
        if (values_count < 1) {
          local_108.x = -3.4028235e+38;
          fVar13 = 3.4028235e+38;
        }
        else {
          iVar4 = 0;
          local_108.x = -3.4028235e+38;
          local_108.y = 0.0;
          uStack_100._0_4_ = 0;
          uStack_100._4_4_ = 0;
          fVar13 = 3.4028235e+38;
          do {
            fVar7 = (*values_getter)(data,iVar4);
            if (!NAN(fVar7)) {
              if (fVar7 <= fVar13) {
                fVar13 = fVar7;
              }
              local_108.y = (float)((uint)local_108.y & extraout_var._0_4_);
              uStack_100._0_4_ = (uint)uStack_100 & extraout_var._4_4_;
              uStack_100._4_4_ = uStack_100._4_4_ & extraout_var._8_4_;
              local_108.x = (float)((uint)local_108.x & -(uint)(fVar7 <= local_108.x) |
                                   ~-(uint)(fVar7 <= local_108.x) & (uint)fVar7);
            }
            iVar4 = iVar4 + 1;
          } while (values_count != iVar4);
        }
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
        local_b8 = (float)(~-(uint)(local_b8 == 3.4028235e+38) & (uint)local_b8 |
                          (uint)fVar13 & -(uint)(local_b8 == 3.4028235e+38));
        local_c8 = (float)(~-(uint)(local_c8 == 3.4028235e+38) & (uint)local_c8 |
                          (uint)local_108.x & -(uint)(local_c8 == 3.4028235e+38));
      }
      IVar9 = local_d8.Max;
      local_108 = local_d8.Min;
      uStack_100 = 0;
      IVar3 = GetColorU32(7,1.0);
      RenderFrame(local_108,IVar9,IVar3,true,(local_f0->Style).FrameRounding);
      if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
        fVar13 = IVar8.x - (float)local_58._0_4_;
        fVar6 = fVar6 - (float)local_98._0_4_;
        iVar4 = (int)(float)local_a8._0_4_;
        if (values_count <= (int)(float)local_a8._0_4_) {
          iVar4 = values_count;
        }
        fVar7 = (float)(values_count - (uint)(plot_type == ImGuiPlotType_Lines));
        local_108.x = fVar7;
        if (((!bVar2) || (fVar17 = (local_f0->IO).MousePos.x, fVar17 < fVar14)) ||
           (fVar18 = (local_f0->IO).MousePos.y, fVar18 < (float)local_78._0_4_)) {
          local_138 = 0xffffffff;
        }
        else {
          local_138 = 0xffffffff;
          if ((fVar17 < fVar13) && (fVar18 < fVar6)) {
            fVar18 = (fVar17 - fVar14) / (fVar13 - fVar14);
            fVar17 = 0.9999;
            if (fVar18 <= 0.9999) {
              fVar17 = fVar18;
            }
            local_138 = (uint)((float)(int)fVar7 * (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar17));
            if (((int)local_138 < 0) || (values_count <= (int)local_138)) {
              __assert_fail("v_idx >= 0 && v_idx < values_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_widgets.cpp"
                            ,0x16b4,
                            "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            fVar7 = (*values_getter)(data,(int)(values_offset + local_138) % values_count);
            (*values_getter)(data,(int)(values_offset + local_138 + 1) % values_count);
            if (plot_type == ImGuiPlotType_Lines) {
              SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)local_138,(ulong)(local_138 + 1));
            }
            else if (plot_type == ImGuiPlotType_Histogram) {
              SetTooltip("%d: %8.4g",(double)fVar7,(ulong)local_138);
            }
          }
        }
        iVar4 = iVar4 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_98 = ZEXT416(~-(uint)(local_b8 == local_c8) & (uint)(1.0 / (local_c8 - local_b8)));
        fVar7 = (*values_getter)(data,values_offset % values_count);
        if (0.0 <= local_c8 * local_b8) {
          local_88 = (float)(~-(uint)(local_b8 < 0.0) & 0x3f800000);
          uStack_84 = 0;
          uStack_80 = 0;
          uStack_7c = 0;
        }
        else {
          uStack_84 = uStack_b4 ^ 0x80000000;
          uStack_80 = uStack_b0 ^ 0x80000000;
          uStack_7c = uStack_ac ^ 0x80000000;
          local_88 = -local_b8 * (float)local_98._0_4_;
        }
        local_e4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        local_e8 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        if (0 < iVar4) {
          fVar17 = (float)local_98._0_4_ * (fVar7 - local_b8);
          fVar7 = 1.0;
          if (fVar17 <= 1.0) {
            fVar7 = fVar17;
          }
          local_c8 = (float)(int)local_108.x;
          local_58 = ZEXT416((uint)(1.0 / (float)iVar4));
          fVar6 = fVar6 - (float)local_78._0_4_;
          local_88 = local_88 * fVar6 + (float)local_78._0_4_;
          fVar18 = 0.0;
          fVar10 = 0.0;
          uVar11 = 0;
          uVar12 = 0;
          fVar7 = (float)(-(uint)(fVar17 < 0.0) & 0x3f800000 |
                         ~-(uint)(fVar17 < 0.0) & (uint)(1.0 - fVar7));
          do {
            uVar5 = (uint)(fVar18 * local_c8 + 0.5);
            if (((int)uVar5 < 0) || (values_count <= (int)uVar5)) {
              __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_widgets.cpp"
                            ,0x16ce,
                            "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            local_108.y = (float)local_58._4_4_;
            local_108.x = (float)local_58._0_4_ + fVar18;
            uStack_100 = local_58._8_8_;
            local_a8._4_4_ = fVar10;
            local_a8._0_4_ = fVar18;
            uStack_a0._0_4_ = uVar11;
            uStack_a0._4_4_ = uVar12;
            fVar17 = (*values_getter)(data,(int)(values_offset + 1 + uVar5) % values_count);
            fVar18 = (fVar17 - local_b8) * (float)local_98._0_4_;
            fVar17 = 1.0;
            if (fVar18 <= 1.0) {
              fVar17 = fVar18;
            }
            fVar17 = (float)(-(uint)(fVar18 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar18 < 0.0) & (uint)(1.0 - fVar17));
            fVar18 = (float)local_a8._0_4_ * (fVar13 - fVar14) + fVar14;
            local_e0.y = fVar7 * fVar6 + (float)local_78._0_4_;
            local_e0.x = fVar18;
            local_110.x = (fVar13 - fVar14) * local_108.x + fVar14;
            if (plot_type == ImGuiPlotType_Lines) {
              local_110.y = fVar6 * fVar17 + (float)local_78._0_4_;
              IVar3 = local_e4;
              if (local_138 == uVar5) {
                IVar3 = local_e8;
              }
              ImDrawList::AddLine(this->DrawList,&local_e0,&local_110,IVar3,1.0);
            }
            else {
              local_110.y = local_88;
              if (plot_type == ImGuiPlotType_Histogram) {
                if (fVar18 + 2.0 <= local_110.x) {
                  local_110.x = local_110.x + -1.0;
                }
                IVar3 = local_e4;
                if (local_138 == uVar5) {
                  IVar3 = local_e8;
                }
                ImDrawList::AddRectFilled(this->DrawList,&local_e0,&local_110,IVar3,0.0,0xf);
              }
            }
            iVar4 = iVar4 + -1;
            fVar18 = local_108.x;
            fVar10 = local_108.y;
            uVar11 = (uint)uStack_100;
            uVar12 = uStack_100._4_4_;
            fVar7 = fVar17;
          } while (iVar4 != 0);
        }
      }
      if (overlay_text != (char *)0x0) {
        local_e0.y = local_d8.Min.y + (local_f0->Style).FramePadding.y;
        local_e0.x = local_d8.Min.x;
        local_110.x = 0.5;
        local_110.y = 0.0;
        RenderTextClipped(&local_e0,&local_d8.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_110,
                          (ImRect *)0x0);
      }
      if (0.0 < local_68.x) {
        IVar9.x = local_d8.Max.x + (local_f0->Style).ItemInnerSpacing.x;
        IVar9.y = (float)local_78._0_4_;
        RenderText(IVar9,local_48,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}